

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O0

void set_standard_handler_restart(int signum,bool restart)

{
  mapped_type *this;
  SignalAction *this_00;
  out_of_range *e;
  int local_c;
  bool restart_local;
  int signum_local;
  
  local_c = signum;
  this = std::
         map<int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>,_std::less<int>,_std::allocator<std::pair<const_int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>_>_>_>
         ::at((map<int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>,_std::less<int>,_std::allocator<std::pair<const_int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>_>_>_>
               *)(anonymous_namespace)::signal_actions,&local_c);
  this_00 = std::reference_wrapper<const_(anonymous_namespace)::SignalAction>::get(this);
  anon_unknown.dwarf_45d97::SignalAction::apply_to(this_00,local_c,restart);
  return;
}

Assistant:

void set_standard_handler_restart(int signum, bool restart) {
    try {
        signal_actions.at(signum).get().apply_to(signum, restart);
    } catch (std::out_of_range &e) {
        die(format("%d is invalid signum", signum));
    }
}